

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

UBool __thiscall icu_63::UVector::operator==(UVector *this,UVector *other)

{
  UBool UVar1;
  long lVar2;
  
  if (this->count == other->count) {
    if (this->comparer == (UElementsAreEqual *)0x0) {
      return '\x01';
    }
    lVar2 = 0;
    do {
      if (this->count <= lVar2) {
        return '\x01';
      }
      UVar1 = (*this->comparer)((UElement)this->elements[lVar2].pointer,
                                (UElement)other->elements[lVar2].pointer);
      lVar2 = lVar2 + 1;
    } while (UVar1 != '\0');
  }
  return '\0';
}

Assistant:

UBool UVector::operator==(const UVector& other) {
    int32_t i;
    if (count != other.count) return FALSE;
    if (comparer != NULL) {
        // Compare using this object's comparer
        for (i=0; i<count; ++i) {
            if (!(*comparer)(elements[i], other.elements[i])) {
                return FALSE;
            }
        }
    }
    return TRUE;
}